

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanCommandBuffer::CopyAccelerationStructure
          (VulkanCommandBuffer *this,VkCopyAccelerationStructureInfoKHR *Info)

{
  char (*in_RCX) [32];
  string msg;
  string local_38;
  
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",in_RCX);
    Diligent::DebugAssertionFailed
              (local_38._M_dataplus._M_p,"CopyAccelerationStructure",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x2af);
    std::__cxx11::string::~string((string *)&local_38);
  }
  EndRenderScope(this);
  FlushBarriers(this);
  (*vkCmdCopyAccelerationStructureKHR)(this->m_VkCmdBuffer,Info);
  return;
}

Assistant:

__forceinline void CopyAccelerationStructure(const VkCopyAccelerationStructureInfoKHR& Info)
    {
#if DILIGENT_USE_VOLK
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        // Copy AS operations must be performed outside of render pass.
        EndRenderScope();
        FlushBarriers();
        vkCmdCopyAccelerationStructureKHR(m_VkCmdBuffer, &Info);
#else
        UNSUPPORTED("Ray tracing is not supported when vulkan library is linked statically");
#endif
    }